

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O2

void __thiscall rsg::VariableManager::popVariableScope(VariableManager *this)

{
  pointer ppVVar1;
  VariableScope *pVVar2;
  long lVar3;
  pointer ppVVar4;
  pointer ppVVar5;
  ulong uVar6;
  Variable *liveVar;
  Variable *local_28;
  
  ppVVar1 = (this->m_variableScopeStack).
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar5 = (this->m_variableScopeStack).
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar6 = (long)ppVVar5 - (long)ppVVar1;
  if (8 < uVar6) {
    pVVar2 = ppVVar5[-1];
    lVar3 = *(long *)((long)ppVVar1 + (uVar6 - 0x10));
    ppVVar4 = (pVVar2->m_liveVariables).
              super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    while ((pVVar2->m_liveVariables).
           super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
           super__Vector_impl_data._M_start != ppVVar4) {
      local_28 = ppVVar4[-1];
      std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::push_back
                ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)(lVar3 + 0x18),
                 &local_28);
      ppVVar4 = (pVVar2->m_liveVariables).
                super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
      (pVVar2->m_liveVariables).
      super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVVar4;
    }
    ppVVar5 = (this->m_variableScopeStack).
              super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  (this->m_variableScopeStack).
  super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar5 + -1;
  return;
}

Assistant:

void VariableManager::popVariableScope (void)
{
	VariableScope& curScope = getCurVariableScope();

	// Migrate live variables to parent scope.
	// Variables allocated in child scopes can be declared in any parent scope but not the other way around.
	if (m_variableScopeStack.size() > 1)
	{
		VariableScope&		parentScope		= *m_variableScopeStack[m_variableScopeStack.size()-2];
		vector<Variable*>&	curLiveVars		= curScope.getLiveVariables();
		vector<Variable*>&	parenLiveVars	= parentScope.getLiveVariables();

		while (!curLiveVars.empty())
		{
			Variable* liveVar = curLiveVars.back();
			parenLiveVars.push_back(liveVar);
			curLiveVars.pop_back();
		}
	}

	// All variables should be either migrated to parent or declared (in case of root scope).
	DE_ASSERT(curScope.getLiveVariables().size() == 0);

	m_variableScopeStack.pop_back();
}